

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_dump_obj(JSContext *ctx,FILE *f,JSValue val)

{
  JSValue val1;
  char *pcVar1;
  JSContext *in_RDX;
  FILE *in_RSI;
  char *in_RDI;
  char *str;
  JSValueUnion in_stack_ffffffffffffffd8;
  
  val1.tag = (int64_t)in_RSI;
  val1.u.float64 = in_stack_ffffffffffffffd8.float64;
  pcVar1 = JS_ToCString((JSContext *)0x11926c,val1);
  if (pcVar1 == (char *)0x0) {
    fprintf(in_RSI,"[exception]\n");
  }
  else {
    fprintf(in_RSI,"%s\n",pcVar1);
    JS_FreeCString(in_RDX,in_RDI);
  }
  return;
}

Assistant:

static void js_dump_obj(JSContext *ctx, FILE *f, JSValueConst val)
{
    const char *str;
    
    str = JS_ToCString(ctx, val);
    if (str) {
        fprintf(f, "%s\n", str);
        JS_FreeCString(ctx, str);
    } else {
        fprintf(f, "[exception]\n");
    }
}